

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O3

Vec_Ptr_t * Abc_NtkDfsReverseNodes(Abc_Ntk_t *pNtk,Abc_Obj_t **ppNodes,int nNodes)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  uint uVar3;
  int *__s;
  Vec_Ptr_t *vNodes;
  void **__s_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar4;
  long lVar5;
  ulong uVar6;
  Abc_Obj_t *pAVar7;
  int iVar8;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcDfs.c"
                  ,299,"Vec_Ptr_t *Abc_NtkDfsReverseNodes(Abc_Ntk_t *, Abc_Obj_t **, int)");
  }
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    iVar1 = pNtk->vObjs->nSize;
    uVar6 = (long)iVar1 + 500;
    iVar8 = (int)uVar6;
    if ((pNtk->vTravIds).nCap < iVar8) {
      __s = (int *)malloc(uVar6 * 4);
      (pNtk->vTravIds).pArray = __s;
      if (__s == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pNtk->vTravIds).nCap = iVar8;
    }
    else {
      __s = (int *)0x0;
    }
    if (-500 < iVar1) {
      memset(__s,0,(uVar6 & 0xffffffff) << 2);
    }
    (pNtk->vTravIds).nSize = iVar8;
  }
  iVar1 = pNtk->nTravIds;
  pNtk->nTravIds = iVar1 + 1;
  if (0x3ffffffe < iVar1) {
    __assert_fail("p->nTravIds < (1<<30)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abc.h"
                  ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
  }
  uVar3 = Abc_AigLevel(pNtk);
  iVar1 = uVar3 + 1;
  vNodes = (Vec_Ptr_t *)malloc(0x10);
  iVar8 = 8;
  if (6 < uVar3) {
    iVar8 = iVar1;
  }
  vNodes->nCap = iVar8;
  if (iVar8 == 0) {
    __s_00 = (void **)0x0;
  }
  else {
    __s_00 = (void **)malloc((long)iVar8 << 3);
  }
  vNodes->pArray = __s_00;
  vNodes->nSize = iVar1;
  memset(__s_00,0,(long)iVar1 << 3);
  if (0 < nNodes) {
    uVar6 = 0;
    uVar4 = extraout_RDX;
    do {
      pAVar7 = ppNodes[uVar6];
      uVar3 = *(uint *)&pAVar7->field_0x14 & 0xf;
      if ((uVar3 != 2) && (uVar3 != 5)) {
        __assert_fail("Abc_ObjIsCi(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcDfs.c"
                      ,0x133,"Vec_Ptr_t *Abc_NtkDfsReverseNodes(Abc_Ntk_t *, Abc_Obj_t **, int)");
      }
      pAVar2 = pAVar7->pNtk;
      iVar1 = pAVar7->Id;
      iVar8 = pAVar2->nTravIds;
      Vec_IntFillExtra(&pAVar2->vTravIds,iVar1 + 1,(int)uVar4);
      if (((long)iVar1 < 0) || ((pAVar2->vTravIds).nSize <= iVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      (pAVar2->vTravIds).pArray[iVar1] = iVar8;
      if (pAVar7->pNtk->ntkType == ABC_NTK_NETLIST) {
        pAVar7 = (Abc_Obj_t *)pAVar7->pNtk->vObjs->pArray[*(pAVar7->vFanouts).pArray];
      }
      uVar4 = extraout_RDX_00;
      if (0 < (pAVar7->vFanouts).nSize) {
        lVar5 = 0;
        do {
          Abc_NtkDfsReverseNodes_rec
                    ((Abc_Obj_t *)pAVar7->pNtk->vObjs->pArray[(pAVar7->vFanouts).pArray[lVar5]],
                     vNodes);
          lVar5 = lVar5 + 1;
          uVar4 = extraout_RDX_01;
        } while (lVar5 < (pAVar7->vFanouts).nSize);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != (uint)nNodes);
  }
  return vNodes;
}

Assistant:

Vec_Ptr_t * Abc_NtkDfsReverseNodes( Abc_Ntk_t * pNtk, Abc_Obj_t ** ppNodes, int nNodes )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj, * pFanout;
    int i, k;
    assert( Abc_NtkIsStrash(pNtk) );
    // set the traversal ID
    Abc_NtkIncrementTravId( pNtk );
    // start the array of nodes
    vNodes = Vec_PtrStart( Abc_AigLevel(pNtk) + 1 );
    for ( i = 0; i < nNodes; i++ )
    {
        pObj = ppNodes[i];
        assert( Abc_ObjIsCi(pObj) );
        Abc_NodeSetTravIdCurrent( pObj );
        pObj = Abc_ObjFanout0Ntk(pObj);
        Abc_ObjForEachFanout( pObj, pFanout, k )
            Abc_NtkDfsReverseNodes_rec( pFanout, vNodes );
    }
    return vNodes;
}